

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search.cpp
# Opt level: O3

UCTNode * megumax::expand(Position *pos,UCTNode *selected_node)

{
  pointer pUVar1;
  bool bVar2;
  uint uVar3;
  vector<megumax::UCTNode,_std::allocator<megumax::UCTNode>_> *pvVar4;
  Move *pMVar5;
  undefined8 uVar6;
  ulong uVar7;
  ulong uVar8;
  MoveList move_list;
  MoveList local_38;
  
  pvVar4 = UCTNode::children(selected_node);
  if ((pvVar4->super__Vector_base<megumax::UCTNode,_std::allocator<megumax::UCTNode>_>)._M_impl.
      super__Vector_impl_data._M_start ==
      (pvVar4->super__Vector_base<megumax::UCTNode,_std::allocator<megumax::UCTNode>_>)._M_impl.
      super__Vector_impl_data._M_finish) {
    bVar2 = UCTNode::is_terminal(selected_node);
    if (!bVar2) {
      libchess::Position::legal_move_list
                (&local_38,pos,(Color)(pos->side_to_move_).super_MetaValueType<int>.value_);
      if (local_38.values_.super__Vector_base<libchess::Move,_std::allocator<libchess::Move>_>.
          _M_impl.super__Vector_impl_data._M_start ==
          local_38.values_.super__Vector_base<libchess::Move,_std::allocator<libchess::Move>_>.
          _M_impl.super__Vector_impl_data._M_finish) {
        UCTNode::is_terminal(selected_node,true);
      }
      else {
        UCTNode::create_children(selected_node,pos,&local_38);
      }
      if (local_38.values_.super__Vector_base<libchess::Move,_std::allocator<libchess::Move>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_38.values_.
                        super__Vector_base<libchess::Move,_std::allocator<libchess::Move>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_38.values_.
                              super__Vector_base<libchess::Move,_std::allocator<libchess::Move>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_38.values_.
                              super__Vector_base<libchess::Move,_std::allocator<libchess::Move>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
    }
  }
  else {
    uVar3 = UCTNode::visited_children(selected_node);
    UCTNode::increment_visited_children(selected_node);
    pvVar4 = UCTNode::children(selected_node);
    uVar8 = (ulong)uVar3;
    pUVar1 = (pvVar4->super__Vector_base<megumax::UCTNode,_std::allocator<megumax::UCTNode>_>).
             _M_impl.super__Vector_impl_data._M_start;
    uVar7 = ((long)(pvVar4->super__Vector_base<megumax::UCTNode,_std::allocator<megumax::UCTNode>_>)
                   ._M_impl.super__Vector_impl_data._M_finish - (long)pUVar1 >> 3) *
            0x2e8ba2e8ba2e8ba3;
    if (uVar7 < uVar8 || uVar7 - uVar8 == 0) {
      uVar6 = std::__throw_out_of_range_fmt
                        ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                        );
      if (local_38.values_.super__Vector_base<libchess::Move,_std::allocator<libchess::Move>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_38.values_.
                        super__Vector_base<libchess::Move,_std::allocator<libchess::Move>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_38.values_.
                              super__Vector_base<libchess::Move,_std::allocator<libchess::Move>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_38.values_.
                              super__Vector_base<libchess::Move,_std::allocator<libchess::Move>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      _Unwind_Resume(uVar6);
    }
    selected_node = pUVar1 + uVar8;
    pMVar5 = UCTNode::move(selected_node);
    libchess::Position::make_move(pos,(Move)pMVar5->value_);
  }
  return selected_node;
}

Assistant:

UCTNode* expand(Position& pos, UCTNode* selected_node) {
    std::vector<UCTNode>& children = selected_node->children();
    if (children.empty()) {
        if (selected_node->is_terminal()) {
            return selected_node;
        }

        MoveList move_list = pos.legal_move_list();
        if (move_list.empty()) {
            selected_node->is_terminal(true);
            return selected_node;
        }

        selected_node->create_children(pos, move_list);

        return selected_node;
    }

    unsigned next_child_index = selected_node->visited_children();
    selected_node->increment_visited_children();
    UCTNode* next_child = &selected_node->children().at(next_child_index);
    assert(pos.is_legal_move(next_child->move()));
    pos.make_move(next_child->move());
    return next_child;
}